

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>::SmallVector
          (SmallVector<(anonymous_namespace)::Constructable,_2UL> *this,
          SmallVector<(anonymous_namespace)::Constructable,_2UL> *other)

{
  move_iterator<(anonymous_namespace)::Constructable_*> first;
  size_type sVar1;
  pointer this_00;
  long lVar2;
  
  (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_ =
       (pointer)(this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).firstElement;
  (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len = 0;
  (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).cap = 0;
  first._M_current = (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_;
  if (first._M_current ==
      (Constructable *)
      (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).firstElement) {
    (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).cap = 2;
    SmallVectorBase<(anonymous_namespace)::Constructable>::
    append<std::move_iterator<(anonymous_namespace)::Constructable_*>_>
              (&this->super_SmallVectorBase<(anonymous_namespace)::Constructable>,first,
               first._M_current +
               (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len);
    sVar1 = (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len;
    if (sVar1 != 0) {
      this_00 = (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_;
      lVar2 = sVar1 << 3;
      do {
        anon_unknown.dwarf_d691dd::Constructable::~Constructable(this_00);
        this_00 = this_00 + 1;
        lVar2 = lVar2 + -8;
      } while (lVar2 != 0);
    }
    (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len = 0;
  }
  else {
    (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_ = (pointer)0x0;
    (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_ = first._M_current;
    sVar1 = (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len;
    (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len = 0;
    (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len = sVar1;
    sVar1 = (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).cap;
    (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).cap = 0;
    (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).cap = sVar1;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }